

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O2

void nsvg__parseUrl(char *id,char *str)

{
  char *pcVar1;
  long lVar2;
  
  pcVar1 = str + 4;
  if (str[4] == '#') {
    pcVar1 = str + 5;
  }
  for (lVar2 = 0; (lVar2 != 0x3f && (pcVar1[lVar2] != ')')); lVar2 = lVar2 + 1) {
    id[lVar2] = pcVar1[lVar2];
  }
  id[lVar2] = '\0';
  return;
}

Assistant:

static void nsvg__parseUrl(char* id, const char* str)
{
	int i = 0;
	str += 4; // "url(";
	if (*str == '#')
		str++;
	while (i < 63 && *str != ')') {
		id[i] = *str++;
		i++;
	}
	id[i] = '\0';
}